

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runtime.cpp
# Opt level: O1

string * __thiscall runtime::Heap::NewString_abi_cxx11_(Heap *this)

{
  size_t *psVar1;
  string *psVar2;
  _List_node_base *p_Var3;
  
  psVar2 = (string *)operator_new(0x20);
  (psVar2->_M_dataplus)._M_p = (pointer)&psVar2->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)psVar2,"");
  p_Var3 = (_List_node_base *)operator_new(0x18);
  p_Var3[1]._M_next = (_List_node_base *)psVar2;
  std::__detail::_List_node_base::_M_hook(p_Var3);
  psVar1 = &(this->createdStrings).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return psVar2;
}

Assistant:

std::string* runtime::Heap::NewString() noexcept {
  auto ret = new std::string{""};
  this->createdStrings.push_back(ret);
  return ret;
}